

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall pbrt::Image::SetChannel(Image *this,Point2i p,int c,Float value)

{
  PixelFormat PVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  float fVar11;
  span<const_float> vin;
  span<const_float> vin_00;
  span<unsigned_char> vout;
  span<unsigned_char> vout_00;
  int local_40;
  float local_3c;
  Tuple2<pbrt::Point2,_int> local_38;
  string local_30;
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = value;
  auVar9 = auVar10._0_16_;
  local_40 = c;
  local_3c = value;
  local_38 = p.super_Tuple2<pbrt::Point2,_int>;
  if (NAN(value)) {
    if (LOGGING_LogLevel < 2) {
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      detail::stringPrintfRecursive<int&,int&,int&>
                (&local_30,"NaN at pixel %d,%d comp %d",&local_38.x,&local_38.y,&local_40);
      Log(Error,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
          ,0x1a5,local_30._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,
                        CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                                 local_30.field_2._M_local_buf[0]) + 1);
      }
    }
    auVar9 = ZEXT816(0) << 0x40;
    local_3c = 0.0;
  }
  PVar1 = this->format;
  iVar4 = local_38.x;
  iVar6 = local_38.y;
  if (PVar1 == Float) {
    (this->p32).ptr
    [(long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar4) *
           (int)(this->channelNames).nStored) + (long)local_40] = auVar9._0_4_;
  }
  else if (PVar1 == Half) {
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar9,auVar8);
    fVar11 = auVar8._0_4_;
    if ((uint)fVar11 < 0x47800000) {
      if ((uint)fVar11 < 0x38800000) {
        uVar5 = SUB42(fVar11 + 0.5,0);
      }
      else {
        uVar5 = (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar5 = (0x7f800000 < (uint)fVar11 | 0x3e) << 9;
    }
    iVar7 = vmovmskps_avx(auVar9);
    (this->p16).ptr
    [(long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar4) *
           (int)(this->channelNames).nStored) + (long)local_40].h = (ushort)(iVar7 << 0xf) | uVar5;
  }
  else {
    if (PVar1 != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
               ,0x1b5,"Unhandled PixelFormat in Image::SetChannel()");
    }
    vout.ptr = (this->p8).ptr +
               (long)local_40 +
               (long)((iVar6 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar4) *
                     (int)(this->channelNames).nStored);
    uVar2 = (this->encoding).
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    if (uVar2 >> 0x31 == 0) {
      auVar8 = vfmadd213ss_fma(auVar9,SUB6416(ZEXT464(0x437f0000),0),ZEXT416(0x3f000000));
      auVar9 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar8);
      uVar3 = vcmpss_avx512f(auVar8,ZEXT816(0) << 0x40,1);
      *vout.ptr = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar9._0_4_);
    }
    else if ((uVar2 & 0xffff000000000000) == 0x2000000000000) {
      vin.n = 1;
      vin.ptr = &local_3c;
      vout.n = 1;
      sRGBColorEncoding::FromLinear((sRGBColorEncoding *)(uVar2 & 0xffffffffffff),vin,vout);
    }
    else {
      vin_00.n = 1;
      vin_00.ptr = &local_3c;
      vout_00.n = 1;
      vout_00.ptr = vout.ptr;
      GammaColorEncoding::FromLinear((GammaColorEncoding *)(uVar2 & 0xffffffffffff),vin_00,vout_00);
    }
  }
  return;
}

Assistant:

inline void Image::SetChannel(Point2i p, int c, Float value) {
    // CHECK(!IsNaN(value));
    if (IsNaN(value)) {
#ifndef PBRT_IS_GPU_CODE
        LOG_ERROR("NaN at pixel %d,%d comp %d", p.x, p.y, c);
#endif
        value = 0;
    }

    switch (format) {
    case PixelFormat::U256:
        encoding.FromLinear({&value, 1}, {&p8[PixelOffset(p) + c], 1});
        break;
    case PixelFormat::Half:
        p16[PixelOffset(p) + c] = Half(value);
        break;
    case PixelFormat::Float:
        p32[PixelOffset(p) + c] = value;
        break;
    default:
        LOG_FATAL("Unhandled PixelFormat in Image::SetChannel()");
    }
}